

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::Descriptor::FindExtensionByLowercaseName(Descriptor *this,string_view name)

{
  bool bVar1;
  FileDescriptor *pFVar2;
  FieldDescriptor *result;
  Descriptor *this_local;
  string_view name_local;
  
  pFVar2 = file(this);
  name_local._M_str =
       (char *)FileDescriptorTables::FindFieldByLowercaseName(pFVar2->tables_,this,name);
  if (((FieldDescriptor *)name_local._M_str == (FieldDescriptor *)0x0) ||
     (bVar1 = FieldDescriptor::is_extension((FieldDescriptor *)name_local._M_str), !bVar1)) {
    name_local._M_str = (char *)0x0;
  }
  return (FieldDescriptor *)name_local._M_str;
}

Assistant:

const FieldDescriptor* Descriptor::FindExtensionByLowercaseName(
    absl::string_view name) const {
  const FieldDescriptor* result =
      file()->tables_->FindFieldByLowercaseName(this, name);
  if (result == nullptr || !result->is_extension()) {
    return nullptr;
  } else {
    return result;
  }
}